

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O1

void __thiscall
chrono::turtlebot::Turtlebot_Part::Turtlebot_Part
          (Turtlebot_Part *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system,ChVector<double> *body_pos,ChQuaternion<double> *body_rot,
          shared_ptr<chrono::ChBodyAuxRef> *chassis_body,bool collide)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  pointer pcVar2;
  ChBodyAuxRef *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 auVar5 [64];
  ChBodyAuxRef *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  long local_68 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ChSystem *local_40;
  ChVector<double> *local_38;
  
  this->_vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_0017f3f0;
  local_50 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_50;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->m_mesh_name).field_2;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)local_48;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  *(undefined1 (*) [16])(this->m_offset).m_data = ZEXT416(0) << 0x40;
  (this->m_offset).m_data[2] = 0.0;
  (this->m_color).R = 1.0;
  (this->m_color).G = 1.0;
  (this->m_color).B = 1.0;
  auVar5 = ZEXT464(0) << 0x40;
  this->m_chassis = (shared_ptr<chrono::ChBodyAuxRef>)auVar5._0_16_;
  this->m_pos = (ChVector<double>)auVar5._16_24_;
  (this->m_rot).m_data[0] = (double)auVar5._40_8_;
  (this->m_rot).m_data[1] = (double)auVar5._48_8_;
  (this->m_rot).m_data[2] = (double)auVar5._56_8_;
  (this->m_rot).m_data[3] = 0.0;
  local_38 = body_pos;
  local_78 = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBodyAuxRef*>
            (&_Stack_70,local_78);
  _Var4._M_pi = _Stack_70._M_pi;
  pCVar3 = local_78;
  local_78 = (ChBodyAuxRef *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar3;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  local_40 = system;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_78 = (ChBodyAuxRef *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_assign((string *)(peVar1 + 8));
  if (local_78 != (ChBodyAuxRef *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  (this->m_chassis).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (chassis_body->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(chassis_body->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  if (&this->m_pos != local_38) {
    (this->m_pos).m_data[0] = local_38->m_data[0];
    (this->m_pos).m_data[1] = local_38->m_data[1];
    (this->m_pos).m_data[2] = local_38->m_data[2];
  }
  if (&this->m_rot != body_rot) {
    (this->m_rot).m_data[0] = body_rot->m_data[0];
    (this->m_rot).m_data[1] = body_rot->m_data[1];
    (this->m_rot).m_data[2] = body_rot->m_data[2];
    (this->m_rot).m_data[3] = body_rot->m_data[3];
  }
  this->m_system = local_40;
  this->m_collide = collide;
  this->m_fixed = fixed;
  return;
}

Assistant:

Turtlebot_Part::Turtlebot_Part(const std::string& name,
                               bool fixed,
                               std::shared_ptr<ChMaterialSurface> mat,
                               ChSystem* system,
                               const ChVector<>& body_pos,
                               const ChQuaternion<>& body_rot,
                               std::shared_ptr<ChBodyAuxRef> chassis_body,
                               bool collide) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
    m_chassis = chassis_body;
    m_mat = mat;
    m_pos = body_pos;
    m_rot = body_rot;
    m_system = system;
    m_collide = collide;
    m_fixed = fixed;
}